

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shape.h
# Opt level: O0

Shape * __thiscall Shape::addPolygon(Shape *this,Polygon *p)

{
  int iVar1;
  Polygon *pPVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  ulong *puVar6;
  Polygon *this_00;
  Polygon *pPVar7;
  ulong uVar8;
  Polygon *local_58;
  int local_30;
  int i;
  Polygon *newPolygons;
  Polygon *p_local;
  Shape *this_local;
  
  uVar4 = (ulong)(this->size + 1);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  uVar5 = SUB168(auVar3 * ZEXT816(0x50),0);
  uVar8 = uVar5 + 8;
  if (SUB168(auVar3 * ZEXT816(0x50),8) != 0 || 0xfffffffffffffff7 < uVar5) {
    uVar8 = 0xffffffffffffffff;
  }
  puVar6 = (ulong *)operator_new__(uVar8);
  *puVar6 = uVar4;
  pPVar7 = (Polygon *)(puVar6 + 1);
  if (uVar4 != 0) {
    local_58 = pPVar7;
    do {
      Polygon::Polygon(local_58);
      local_58 = local_58 + 0x50;
    } while (local_58 != pPVar7 + uVar4 * 0x50);
  }
  for (local_30 = 0; local_30 < this->size; local_30 = local_30 + 1) {
    Polygon::operator=(pPVar7 + (long)local_30 * 0x50,this->polygons + (long)local_30 * 0x50);
  }
  iVar1 = this->size;
  this->size = iVar1 + 1;
  Polygon::operator=(pPVar7 + (long)iVar1 * 0x50,p);
  if ((this->polygons != (Polygon *)0x0) && (pPVar2 = this->polygons, pPVar2 != (Polygon *)0x0)) {
    this_00 = pPVar2 + *(long *)(pPVar2 + -8) * 0x50;
    while (pPVar2 != this_00) {
      this_00 = this_00 + -0x50;
      Polygon::~Polygon(this_00);
    }
    operator_delete__(pPVar2 + -8);
  }
  this->polygons = pPVar7;
  return this;
}

Assistant:

Shape& addPolygon(const Polygon& p) {
    Polygon* newPolygons = new Polygon[size + 1];
    for(int i = 0; i < size; i++) {
      newPolygons[i] = polygons[i];
    }
    newPolygons[size++] = p;
    if (polygons != NULL) delete[] polygons;
    polygons = newPolygons;

    return *this;
  }